

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O1

void __thiscall
fasttext::HierarchicalSoftmaxLoss::dfs
          (HierarchicalSoftmaxLoss *this,int32_t k,real threshold,int32_t node,real score,
          Predictions *heap,Vector *hidden)

{
  pointer *pppVar1;
  int32_t node_00;
  int iVar2;
  pointer ppVar3;
  iterator __position;
  pointer pNVar4;
  element_type *peVar5;
  pointer ppVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  float fVar14;
  double dVar15;
  undefined1 auVar16 [64];
  float local_54;
  pair<float,_int> local_40;
  double local_38;
  undefined1 extraout_var [56];
  
  local_38 = (double)threshold + 1e-05;
  local_54 = score;
  while( true ) {
    auVar16._0_8_ = log(local_38);
    auVar16._8_56_ = extraout_var;
    auVar13._0_4_ = (float)auVar16._0_8_;
    auVar13._4_12_ = auVar16._4_12_;
    if (local_54 < auVar13._0_4_) {
      return;
    }
    ppVar3 = (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    __position._M_current =
         (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (((long)__position._M_current - (long)ppVar3 >> 3 == (long)k) &&
       (fVar14 = ppVar3->first, auVar13 = ZEXT416((uint)fVar14), local_54 < fVar14)) {
      return;
    }
    lVar9 = (long)node;
    pNVar4 = (this->tree_).
             super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pNVar4[lVar9].left == -1) && (pNVar4[lVar9].right == -1)) break;
    peVar5 = (((this->super_BinaryLogisticLoss).super_Loss.wo_)->
             super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar5->_vptr_Matrix[2])(peVar5,hidden,lVar9 - this->osz_);
    auVar8._8_4_ = 0x80000000;
    auVar8._0_8_ = 0x8000000080000000;
    auVar8._12_4_ = 0x80000000;
    auVar13 = vxorps_avx512vl(auVar13,auVar8);
    fVar14 = expf(auVar13._0_4_);
    fVar14 = 1.0 / (fVar14 + 1.0);
    node_00 = (this->tree_).
              super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar9].left;
    dVar15 = log((double)(1.0 - fVar14) + 1e-05);
    dfs(this,k,threshold,node_00,(float)dVar15 + local_54,heap,hidden);
    node = (this->tree_).
           super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar9].right;
    dVar15 = log((double)fVar14 + 1e-05);
    local_54 = (float)dVar15 + local_54;
  }
  local_40.first = local_54;
  if (__position._M_current ==
      (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_40.second = node;
    std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
    _M_realloc_insert<std::pair<float,int>>
              ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,__position,
               &local_40);
  }
  else {
    (__position._M_current)->first = local_54;
    (__position._M_current)->second = node;
    pppVar1 = &(heap->
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  ppVar3 = (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar6 = (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar14 = ppVar6[-1].first;
  iVar2 = ppVar6[-1].second;
  uVar10 = (long)ppVar6 - (long)ppVar3 >> 3;
  lVar9 = uVar10 - 1;
  if (1 < (long)uVar10) {
    do {
      lVar11 = (lVar9 + -1) - (lVar9 + -1 >> 0x3f) >> 1;
      if (ppVar3[lVar11].first <= fVar14) break;
      ppVar3[lVar9].first = ppVar3[lVar11].first;
      ppVar3[lVar9].second = ppVar3[lVar11].second;
      bVar7 = 2 < lVar9;
      lVar9 = lVar11;
    } while (bVar7);
  }
  ppVar3[lVar9].first = fVar14;
  ppVar3[lVar9].second = iVar2;
  if ((ulong)(long)k < uVar10) {
    if (8 < (long)ppVar6 - (long)ppVar3) {
      fVar14 = ppVar6[-1].first;
      iVar2 = ppVar6[-1].second;
      ppVar6[-1].first = ppVar3->first;
      ppVar6[-1].second = ppVar3->second;
      uVar10 = (long)(ppVar6 + -1) - (long)ppVar3;
      lVar9 = (long)uVar10 >> 3;
      if (lVar9 < 3) {
        lVar11 = 0;
      }
      else {
        lVar12 = 0;
        do {
          if (ppVar3[lVar12 * 2 + 1].first < ppVar3[lVar12 * 2 + 2].first) {
            lVar11 = lVar12 * 2 + 1;
          }
          else {
            lVar11 = lVar12 * 2 + 2;
          }
          ppVar3[lVar12].first = ppVar3[lVar11].first;
          ppVar3[lVar12].second = ppVar3[lVar11].second;
          lVar12 = lVar11;
        } while (lVar11 < (lVar9 + -1) - (lVar9 + -1 >> 0x3f) >> 1);
      }
      if (((uVar10 & 8) == 0) && (lVar11 == lVar9 + -2 >> 1)) {
        ppVar3[lVar11].first = ppVar3[lVar11 * 2 + 1].first;
        ppVar3[lVar11].second = ppVar3[lVar11 * 2 + 1].second;
        lVar11 = lVar11 * 2 + 1;
      }
      if (0 < lVar11) {
        do {
          lVar9 = (lVar11 + -1) - (lVar11 + -1 >> 0x3f) >> 1;
          if (ppVar3[lVar9].first <= fVar14) break;
          ppVar3[lVar11].first = ppVar3[lVar9].first;
          ppVar3[lVar11].second = ppVar3[lVar9].second;
          bVar7 = 2 < lVar11;
          lVar11 = lVar9;
        } while (bVar7);
      }
      ppVar3[lVar11].first = fVar14;
      ppVar3[lVar11].second = iVar2;
    }
    (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = ppVar6 + -1;
  }
  return;
}

Assistant:

void HierarchicalSoftmaxLoss::dfs(
    int32_t k,
    real threshold,
    int32_t node,
    real score,
    Predictions& heap,
    const Vector& hidden) const {
  if (score < std_log(threshold)) {
    return;
  }
  if (heap.size() == k && score < heap.front().first) {
    return;
  }

  if (tree_[node].left == -1 && tree_[node].right == -1) {
    heap.push_back(std::make_pair(score, node));
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
    return;
  }

  real f = wo_->dotRow(hidden, node - osz_);
  f = 1. / (1 + std::exp(-f));

  dfs(k, threshold, tree_[node].left, score + std_log(1.0 - f), heap, hidden);
  dfs(k, threshold, tree_[node].right, score + std_log(f), heap, hidden);
}